

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O2

int condvar_timedwait(worker_config_conflict *c,int *flag)

{
  uv_mutex_t *puVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar1 = &c->mutex;
  uv_mutex_lock(puVar1);
  uv_sem_post(c);
  do {
    iVar2 = uv_cond_timedwait(&c->cond,puVar1,1000000000);
    eval_a = (int64_t)iVar2;
    eval_b = 0;
    if (eval_a != 0) {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0xb3;
      goto LAB_00118c90;
    }
    eval_b = (int64_t)*flag;
  } while (eval_b == 0);
  eval_a = 1;
  if (eval_b == 1) {
    uv_mutex_unlock(puVar1);
    uv_sem_wait(&c->sem_signaled);
    return iVar2;
  }
  pcVar5 = "*flag";
  pcVar4 = "1";
  uVar3 = 0xb5;
LAB_00118c90:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

static int condvar_timedwait(worker_config* c, const int* flag) {
  int r;

  r = 0;

  uv_mutex_lock(&c->mutex);

  /* Tell signal'er that I am waiting. */
  uv_sem_post(&c->sem_waiting);

  /* Wait until I get a non-spurious signal. */
  do {
    r = uv_cond_timedwait(&c->cond, &c->mutex, (uint64_t)(1 * 1e9)); /* 1 s */
    ASSERT_OK(r); /* Should not time out. */
  } while (*flag == 0);
  ASSERT_EQ(1, *flag);

  uv_mutex_unlock(&c->mutex);

  /* Wait for my signal'er to finish. */
  uv_sem_wait(&c->sem_signaled);
  return r;
}